

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:546:66)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:546:66)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap_ptr<mjs::global_object> *this_00;
  gc_heap *h;
  uint32_t uVar1;
  global_object *this_01;
  long *plVar2;
  gc_heap_ptr_untyped *this_02;
  undefined8 *puVar3;
  uint32_t index;
  uint uVar4;
  gc_heap_ptr<mjs::global_object> global;
  value v;
  wstring s;
  object_ptr o;
  gc_heap_ptr_untyped local_170;
  gc_heap_ptr_untyped local_160;
  value local_150;
  gc_heap *local_128;
  undefined1 local_120 [24];
  vector<mjs::value,_std::allocator<mjs::value>_> local_108;
  undefined8 local_e8;
  wchar_t *local_e0;
  gc_heap_ptr_untyped local_d8;
  wstring_view local_c8;
  double local_b8;
  anon_union_32_5_7b1e0779_for_value_3 local_b0;
  gc_heap_ptr_untyped local_90;
  wchar_t *local_80;
  anon_union_32_5_7b1e0779_for_value_3 local_78;
  value local_58;
  
  if ((int)(this->f).version < 2) {
    this_00 = &(this->f).global;
    this_01 = (global_object *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    plVar2 = (long *)gc_heap_ptr_untyped::get(&this_00->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar2 + 0x70))(&local_150,plVar2);
    global_object::validate_type(this_01,this_,(object_ptr *)&local_150,"array");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_150);
  }
  this_02 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  h = this_02->heap_;
  puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_02);
  local_b8 = 2.96439387504748e-323;
  local_b0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x17e1d4;
  (**(code **)*puVar3)(&local_150,puVar3);
  uVar1 = to_uint32(&local_150);
  value::~value(&local_150);
  local_128 = (gc_heap *)(local_120 + 8);
  local_120._0_8_ = 0;
  local_120._8_4_ = 0;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_160,&(this->f).global.super_gc_heap_ptr_untyped);
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      std::__cxx11::wstring::append((wchar_t *)&local_128);
    }
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_02);
    index_string_abi_cxx11_((wstring *)&local_b8,(mjs *)(ulong)uVar4,index);
    local_80 = (wchar_t *)local_b0.n_;
    local_78.n_ = local_b8;
    (**(code **)*puVar3)(&local_150,puVar3,(value *)&local_80);
    std::__cxx11::wstring::~wstring((wstring *)&local_b8);
    if (null < local_150.type_) {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_160);
      (**(code **)(*plVar2 + 0x88))(&local_90,plVar2,&local_150);
      puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&local_90);
      local_e8 = 0xe;
      local_e0 = L"toLocaleString";
      (**(code **)*puVar3)((value *)&local_80,puVar3,&local_e8);
      value::value(&local_58,(object_ptr *)&local_90);
      local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      call_function((value *)&local_b8,(value *)&local_80,&local_58,&local_108);
      to_string((mjs *)&local_d8,h,(value *)&local_b8);
      local_c8 = string::view((string *)&local_d8);
      std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                ((wstring *)&local_128,&local_c8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d8);
      value::~value((value *)&local_b8);
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_108);
      value::~value(&local_58);
      value::~value((value *)&local_80);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_90);
    }
    value::~value(&local_150);
  }
  local_150._0_8_ = local_120._0_8_;
  local_150.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_128
  ;
  string::string((string *)&local_170,h,(wstring_view *)&local_150);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
  std::__cxx11::wstring::~wstring((wstring *)&local_128);
  value::value(__return_storage_ptr__,(string *)&local_170);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_170);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }